

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

bool __thiscall tinyxml2::XMLElement::ShallowEqual(XMLElement *this,XMLNode *compare)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  char *pcVar4;
  char *pcVar5;
  XMLAttribute *pXVar6;
  bool bVar7;
  bool bVar8;
  long *plVar2;
  
  iVar1 = (*compare->_vptr_XMLNode[6])(compare);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 == (long *)0x0) {
LAB_001694bf:
    bVar7 = false;
  }
  else {
    lVar3 = (**(code **)(*plVar2 + 0x48))(plVar2);
    if (lVar3 == 0) {
      pcVar4 = StrPair::GetStr((StrPair *)(plVar2 + 3));
    }
    else {
      pcVar4 = (char *)0x0;
    }
    iVar1 = (*(this->super_XMLNode)._vptr_XMLNode[9])(this);
    if (CONCAT44(extraout_var_00,iVar1) == 0) {
      pcVar5 = StrPair::GetStr(&(this->super_XMLNode)._value);
    }
    else {
      pcVar5 = (char *)0x0;
    }
    if (pcVar4 != pcVar5) {
      iVar1 = strncmp(pcVar4,pcVar5,0x7fffffff);
      if (iVar1 != 0) goto LAB_001694bf;
    }
    lVar3 = plVar2[0xe];
    pXVar6 = this->_rootAttribute;
    bVar7 = pXVar6 != (XMLAttribute *)0x0;
    bVar8 = lVar3 != 0;
    if (bVar8 && bVar7) {
      do {
        pcVar4 = StrPair::GetStr(&pXVar6->_value);
        pcVar5 = StrPair::GetStr((StrPair *)(lVar3 + 0x20));
        if (pcVar4 != pcVar5) {
          iVar1 = strncmp(pcVar4,pcVar5,0x7fffffff);
          if (iVar1 != 0) goto LAB_001694bf;
        }
        lVar3 = *(long *)(lVar3 + 0x40);
        pXVar6 = pXVar6->_next;
        bVar7 = pXVar6 != (XMLAttribute *)0x0;
        bVar8 = lVar3 != 0;
      } while ((bVar8) && (pXVar6 != (XMLAttribute *)0x0));
    }
    bVar7 = (bool)((bVar7 | bVar8) ^ 1);
  }
  return bVar7;
}

Assistant:

bool XMLElement::ShallowEqual( const XMLNode* compare ) const
{
    TIXMLASSERT( compare );
    const XMLElement* other = compare->ToElement();
    if ( other && XMLUtil::StringEqual( other->Name(), Name() )) {

        const XMLAttribute* a=FirstAttribute();
        const XMLAttribute* b=other->FirstAttribute();

        while ( a && b ) {
            if ( !XMLUtil::StringEqual( a->Value(), b->Value() ) ) {
                return false;
            }
            a = a->Next();
            b = b->Next();
        }
        if ( a || b ) {
            // different count
            return false;
        }
        return true;
    }
    return false;
}